

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# charconv_bigint.h
# Opt level: O0

void __thiscall
absl::strings_internal::BigUnsigned<84>::MultiplyBy(BigUnsigned<84> *this,uint32_t v)

{
  int local_2c;
  ulong uStack_28;
  int i;
  uint64_t window;
  uint64_t factor;
  uint32_t v_local;
  BigUnsigned<84> *this_local;
  
  if ((this->size_ != 0) && (v != 1)) {
    if (v == 0) {
      SetToZero(this);
    }
    else {
      uStack_28 = 0;
      for (local_2c = 0; local_2c < this->size_; local_2c = local_2c + 1) {
        uStack_28 = (ulong)v * (ulong)this->words_[local_2c] + uStack_28;
        this->words_[local_2c] = (uint32_t)uStack_28;
        uStack_28 = uStack_28 >> 0x20;
      }
      if ((uStack_28 != 0) && (this->size_ < 0x54)) {
        this->words_[this->size_] = (uint32_t)uStack_28;
        this->size_ = this->size_ + 1;
      }
    }
  }
  return;
}

Assistant:

void MultiplyBy(uint32_t v) {
    if (size_ == 0 || v == 1) {
      return;
    }
    if (v == 0) {
      SetToZero();
      return;
    }
    const uint64_t factor = v;
    uint64_t window = 0;
    for (int i = 0; i < size_; ++i) {
      window += factor * words_[i];
      words_[i] = window & 0xffffffff;
      window >>= 32;
    }
    // If carry bits remain and there's space for them, grow size_.
    if (window && size_ < max_words) {
      words_[size_] = window & 0xffffffff;
      ++size_;
    }
  }